

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

void __thiscall Fossilize::FeatureFilter::FeatureFilter(FeatureFilter *this)

{
  Impl *this_00;
  FeatureFilter *this_local;
  
  this_00 = (Impl *)operator_new(0x1460);
  Impl::Impl(this_00);
  this->impl = this_00;
  return;
}

Assistant:

FeatureFilter::FeatureFilter()
{
	impl = new Impl;
}